

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

Vec_Ptr_t * Abc_NodeFindCone_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  int local_40;
  int i;
  int RetValue;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  Abc_Obj_t *pNodeC;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNode_local;
  
  vNodes = (Vec_Ptr_t *)pNode;
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x1ca,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsCi((Abc_Obj_t *)vNodes);
  if (iVar1 == 0) {
    pNodeC = (Abc_Obj_t *)Vec_PtrAlloc(4);
    iVar1 = Abc_NodeIsMuxType((Abc_Obj_t *)vNodes);
    if (iVar1 == 0) {
      iVar1 = Abc_NodeBalanceCone_rec((Abc_Obj_t *)vNodes,(Vec_Ptr_t *)pNodeC,1,1,0);
      if (*(int *)((long)&pNodeC->pNtk + 4) < 2) {
        __assert_fail("vNodes->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                      ,0x1db,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
      }
      for (local_40 = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pNodeC), local_40 < iVar2;
          local_40 = local_40 + 1) {
        vNodes = (Vec_Ptr_t *)Vec_PtrEntry((Vec_Ptr_t *)pNodeC,local_40);
        pAVar4 = Abc_ObjRegular((Abc_Obj_t *)vNodes);
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffdf;
      }
      if (iVar1 == -1) {
        *(undefined4 *)((long)&pNodeC->pNtk + 4) = 0;
      }
    }
    else {
      pNodeT = Abc_NodeRecognizeMux((Abc_Obj_t *)vNodes,&pNodeE,(Abc_Obj_t **)&i);
      pAVar4 = pNodeC;
      pAVar3 = Abc_ObjRegular(pNodeT);
      Vec_PtrPush((Vec_Ptr_t *)pAVar4,pAVar3);
      pAVar4 = pNodeC;
      pAVar3 = Abc_ObjRegular(pNodeE);
      Vec_PtrPushUnique((Vec_Ptr_t *)pAVar4,pAVar3);
      pAVar4 = pNodeC;
      pAVar3 = Abc_ObjRegular(_i);
      Vec_PtrPushUnique((Vec_Ptr_t *)pAVar4,pAVar3);
    }
    for (local_40 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNodeC), local_40 < iVar1;
        local_40 = local_40 + 1) {
      vNodes = (Vec_Ptr_t *)Vec_PtrEntry((Vec_Ptr_t *)pNodeC,local_40);
      vNodes = (Vec_Ptr_t *)Abc_ObjRegular((Abc_Obj_t *)vNodes);
      if ((((Abc_Obj_t *)vNodes)->field_6).pTemp == (void *)0x0) {
        pVVar5 = Abc_NodeFindCone_rec((Abc_Obj_t *)vNodes);
        *(Vec_Ptr_t **)(vNodes + 4) = pVVar5;
      }
    }
    pNode_local = pNodeC;
  }
  else {
    pNode_local = (Abc_Obj_t *)0x0;
  }
  return (Vec_Ptr_t *)pNode_local;
}

Assistant:

Vec_Ptr_t * Abc_NodeFindCone_rec( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNodeC, * pNodeT, * pNodeE;
    int RetValue, i;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( Abc_ObjIsCi(pNode) )
        return NULL;
    // start the new array
    vNodes = Vec_PtrAlloc( 4 );
    // if the node is the MUX collect its fanins
    if ( Abc_NodeIsMuxType(pNode) )
    {
        pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
        Vec_PtrPush( vNodes, Abc_ObjRegular(pNodeC) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeT) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeE) );
    }
    else
    {
        // collect the nodes in the implication supergate
        RetValue = Abc_NodeBalanceCone_rec( pNode, vNodes, 1, 1, 0 );
        assert( vNodes->nSize > 1 );
        // unmark the visited nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            Abc_ObjRegular(pNode)->fMarkB = 0;
        // if we found the node and its complement in the same implication supergate, 
        // return empty set of nodes (meaning that we should use constant-0 node)
        if ( RetValue == -1 )
            vNodes->nSize = 0;
    }
    // call for the fanin
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNode = Abc_ObjRegular(pNode);
        if ( pNode->pCopy )
            continue;
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeFindCone_rec( pNode );
    }
    return vNodes;
}